

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-connection-fail.c
# Opt level: O2

void on_connect_without_close(uv_connect_t *req,int status)

{
  char *pcVar1;
  char *pcVar2;
  undefined8 uVar3;
  int64_t eval_b;
  int64_t eval_a;
  
  eval_a = (int64_t)status;
  eval_b = -0x6f;
  if (eval_a == -0x6f) {
    connect_cb_calls = connect_cb_calls + 1;
    uv_timer_start(&timer,timer_cb,100,0);
    eval_a = (int64_t)close_cb_calls;
    eval_b = 0;
    if (eval_a == 0) {
      return;
    }
    pcVar2 = "0";
    pcVar1 = "close_cb_calls";
    uVar3 = 0x54;
  }
  else {
    pcVar2 = "UV_ECONNREFUSED";
    pcVar1 = "status";
    uVar3 = 0x4f;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-connection-fail.c"
          ,uVar3,pcVar1,"==",pcVar2,eval_a,"==",eval_b);
  abort();
}

Assistant:

static void on_connect_without_close(uv_connect_t *req, int status) {
  ASSERT_EQ(status, UV_ECONNREFUSED);
  connect_cb_calls++;

  uv_timer_start(&timer, timer_cb, 100, 0);

  ASSERT_OK(close_cb_calls);
}